

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfdcore_elements_transaction.cpp
# Opt level: O1

void __thiscall
cfd::core::ConfidentialValue::ConfidentialValue(ConfidentialValue *this,ConfidentialValue *object)

{
  this->_vptr_ConfidentialValue = (_func_int **)&PTR__ConfidentialValue_0025b008;
  ByteData::ByteData(&this->data_);
  ::std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)&this->data_,
             &(object->data_).data_);
  this->version_ = object->version_;
  return;
}

Assistant:

ConfidentialValue::ConfidentialValue(const ConfidentialValue &object) {
  data_ = object.data_;
  version_ = object.version_;
}